

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O2

void tool_help(void)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x4c0; lVar1 = lVar1 + 8) {
    puts(*(char **)((long)helptext + lVar1));
  }
  return;
}

Assistant:

void tool_help(void)
{
  int i;
  for(i = 0; helptext[i]; i++) {
    puts(helptext[i]);
#ifdef PRINT_LINES_PAUSE
    if(i && ((i % PRINT_LINES_PAUSE) == 0))
      tool_pressanykey();
#endif
  }
}